

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O0

bool midi_processor::process_riff_midi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  const_reference pvVar9;
  difference_type dVar10;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var11;
  ulong uVar12;
  int *piVar13;
  reference pvVar14;
  char *p_name;
  midi_meta_data_item local_258;
  uchar *local_210;
  uchar *local_208;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f0;
  uint local_1e4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_1e0;
  uint i;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  string local_1d0 [8];
  string field;
  uint32_t field_size;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  const_iterator chunk_end;
  midi_meta_data_item local_180;
  uchar *local_138;
  uchar *local_130;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  uchar *local_110;
  uint32_t local_104;
  uchar *puStack_100;
  uint32_t type;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  uchar *local_f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  uint32_t chunk_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  midi_meta_data meta_data;
  bool found_info;
  const_iterator cStack_50;
  bool found_data;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator body_end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator it;
  uint32_t file_size;
  midi_container *p_out_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
  vVar1 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5);
  vVar2 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,6);
  vVar3 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,7);
  it._M_current._4_4_ = CONCAT13(*pvVar9,CONCAT12(vVar3,CONCAT11(vVar2,vVar1)));
  body_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_30 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&body_end,0xc);
  cStack_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_48 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&stack0xffffffffffffffb0,8);
  local_40 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_48,(ulong)it._M_current._4_4_);
  bVar4 = false;
  bVar6 = false;
  midi_meta_data::midi_meta_data
            ((midi_meta_data *)
             &extra_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size);
  do {
    bVar5 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar5) break;
    dVar10 = __gnu_cxx::operator-(&local_40,&local_30);
    if (dVar10 < 8) {
      p_file_local._7_1_ = 0;
      goto LAB_0012bd26;
    }
    _Var11 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_30,4);
    uVar7 = toInt32LE((const_iterator)_Var11._M_current);
    uVar12 = __gnu_cxx::operator-(&local_40,&local_30);
    if (uVar12 < uVar7) {
      p_file_local._7_1_ = 0;
      goto LAB_0012bd26;
    }
    midi_file.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_30._M_current;
    bVar5 = it_equal((const_iterator)local_30._M_current,"data",4);
    if (bVar5) {
      if (bVar4) {
        p_file_local._7_1_ = 0;
        goto LAB_0012bd26;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_30,8);
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_30,8);
      local_f0 = (uchar *)__gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+(&local_f8,(ulong)uVar7);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_e0,local_e8,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_f0);
      bVar5 = process_standard_midi
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,p_out);
      if (bVar5) {
        bVar4 = true;
      }
      else {
        p_file_local._7_1_ = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      if (!bVar5) goto LAB_0012bd26;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_30,(ulong)(uVar7 + 8));
      if (((uVar7 & 1) != 0) && (bVar5 = __gnu_cxx::operator!=(&local_30,&local_40), bVar5)) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&local_30);
      }
    }
    else {
      puStack_100 = local_30._M_current;
      bVar5 = it_equal((const_iterator)local_30._M_current,"DISP",4);
      if (bVar5) {
        local_110 = (uchar *)__gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_30,8);
        local_104 = toInt32LE((const_iterator)local_110);
        if (local_104 == 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size,
                     (ulong)(uVar7 - 3));
          local_118 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_30,0xc);
          local_128 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_30,8);
          local_120 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_128,(ulong)uVar7);
          local_130 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &chunk_size);
          local_138 = (uchar *)std::
                               copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                         (local_118,local_120,
                                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           )local_130);
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size,
                               (ulong)(uVar7 - 4));
          *pvVar14 = '\0';
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size,
                               0);
          midi_meta_data_item::midi_meta_data_item(&local_180,0,"display_name",(char *)pvVar14);
          midi_meta_data::add_item
                    ((midi_meta_data *)
                     &extra_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_180);
          midi_meta_data_item::~midi_meta_data_item(&local_180);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+=(&local_30,(ulong)(uVar7 + 8));
        if (((uVar7 & 1) != 0) && (bVar5 = __gnu_cxx::operator!=(&local_30,&local_40), bVar5)) {
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&local_30);
        }
      }
      else {
        chunk_end._M_current = local_30._M_current;
        bVar5 = it_equal((const_iterator)local_30._M_current,"LIST",4);
        if (bVar5) {
          local_198 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_30,8);
          local_190 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_198,(ulong)uVar7);
          _Var11 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_30,8);
          bVar5 = it_equal((const_iterator)_Var11._M_current,"INFO",4);
          if (!bVar5) {
            p_file_local._7_1_ = 0;
            goto LAB_0012bd26;
          }
          if (bVar6) {
            p_file_local._7_1_ = 0;
            goto LAB_0012bd26;
          }
          dVar10 = __gnu_cxx::operator-(&local_190,&local_30);
          if (dVar10 < 0xc) {
            p_file_local._7_1_ = 0;
            goto LAB_0012bd26;
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+=(&local_30,0xc);
          while (bVar6 = __gnu_cxx::operator!=(&local_30,&local_190), bVar6) {
            dVar10 = __gnu_cxx::operator-(&local_190,&local_30);
            if (dVar10 < 4) {
              p_file_local._7_1_ = 0;
              goto LAB_0012bd26;
            }
            field.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_30,4);
            uVar8 = toInt32LE((const_iterator)field.field_2._8_8_);
            uVar12 = __gnu_cxx::operator-(&local_190,&local_30);
            if (uVar12 < uVar8 + 8) {
              p_file_local._7_1_ = 0;
              goto LAB_0012bd26;
            }
            std::__cxx11::string::string(local_1d0);
            local_1d8._M_current = local_30._M_current;
            _Stack_1e0 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_30,4);
            std::__cxx11::string::
            assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      (local_1d0,local_1d8,_Stack_1e0);
            for (local_1e4 = 0; local_1e4 < 0x14; local_1e4 = local_1e4 + 1) {
              piVar13 = (int *)__gnu_cxx::
                               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ::operator[](&local_30,0);
              if (*piVar13 == *(int *)riff_tag_mappings[local_1e4][0]) {
                std::__cxx11::string::operator=(local_1d0,riff_tag_mappings[local_1e4][1]);
                break;
              }
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size,
                       (ulong)(uVar8 + 1));
            local_1f0 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_30,8);
            local_200 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_30,8);
            local_1f8 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_200,(ulong)uVar8);
            local_208 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&chunk_size);
            local_210 = (uchar *)std::
                                 copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                           (local_1f0,local_1f8,
                                            (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             )local_208);
            pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &chunk_size,(ulong)uVar8);
            *pvVar14 = '\0';
            __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator+=(&local_30,(ulong)(uVar8 + 8));
            p_name = (char *)std::__cxx11::string::c_str();
            pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &chunk_size,0);
            midi_meta_data_item::midi_meta_data_item(&local_258,0,p_name,(char *)pvVar14);
            midi_meta_data::add_item
                      ((midi_meta_data *)
                       &extra_buffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_258);
            midi_meta_data_item::~midi_meta_data_item(&local_258);
            if (((uVar8 & 1) != 0) && (bVar6 = __gnu_cxx::operator!=(&local_30,&local_190), bVar6))
            {
              __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator++(&local_30);
            }
            std::__cxx11::string::~string(local_1d0);
          }
          bVar6 = true;
          local_30._M_current = local_190._M_current;
          if (((uVar7 & 1) != 0) && (bVar5 = __gnu_cxx::operator!=(&local_30,&local_40), bVar5)) {
            __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator++(&local_30);
          }
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+=(&local_30,(ulong)uVar7);
          if (((uVar7 & 1) != 0) && (bVar5 = __gnu_cxx::operator!=(&local_30,&local_40), bVar5)) {
            __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator++(&local_30);
          }
        }
      }
    }
  } while ((!bVar4) || (!bVar6));
  midi_container::set_extra_meta_data
            (p_out,(midi_meta_data *)
                   &extra_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  p_file_local._7_1_ = 1;
LAB_0012bd26:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size);
  midi_meta_data::~midi_meta_data
            ((midi_meta_data *)
             &extra_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return (bool)(p_file_local._7_1_ & 1);
}

Assistant:

bool midi_processor::process_riff_midi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    bool found_data = false;
    bool found_info = false;

    midi_meta_data meta_data;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = toInt32LE( it + 4 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal( it, "data", 4 ) )
        {
            if ( !found_data )
            {
                std::vector<uint8_t> midi_file;
                midi_file.assign( it + 8, it + 8 + chunk_size );
                if ( !process_standard_midi( midi_file, p_out ) ) return false;
                found_data = true;
            }
            else return false; /*throw exception_io_data( "Multiple RIFF data chunks found" );*/
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "DISP", 4 ) )
        {
            uint32_t type = toInt32LE( it + 8 );
            if ( type == 1 )
            {
                extra_buffer.resize( chunk_size - 4 + 1 );
                std::copy( it + 12, it + 8 + chunk_size, extra_buffer.begin() );
				extra_buffer[ chunk_size - 4 ] = '\0';
                meta_data.add_item( midi_meta_data_item( 0, "display_name", (const char *) &extra_buffer[0] ) );
            }
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "LIST", 4 ) )
        {
            std::vector<uint8_t>::const_iterator chunk_end = it + 8 + chunk_size;
            if ( it_equal( it + 8, "INFO", 4 ) )
            {
                if ( !found_info )
                {
                    if ( chunk_end - it < 12 ) return false;
                    it += 12;
                    while ( it != chunk_end )
                    {
                        if ( chunk_end - it < 4 ) return false;
                        uint32_t field_size = toInt32LE( it + 4 );
                        if ( (unsigned long)(chunk_end - it) < 8 + field_size ) return false;
                        std::string field;
                        field.assign( it, it + 4 );
                        for ( unsigned i = 0; i < _countof(riff_tag_mappings); ++i )
                        {
                            if ( !memcmp( &it[0], riff_tag_mappings[ i ][ 0 ], 4 ) )
                            {
                                field = riff_tag_mappings[ i ][ 1 ];
                                break;
                            }
                        }
                        extra_buffer.resize( field_size + 1 );
                        std::copy( it + 8, it + 8 + field_size, extra_buffer.begin() );
						extra_buffer[ field_size ] = '\0';
                        it += 8 + field_size;
                        meta_data.add_item( midi_meta_data_item( 0, field.c_str(), ( const char * ) &extra_buffer[0] ) );
                        if ( field_size & 1 && it != chunk_end ) ++it;
                    }
                    found_info = true;
                }
                else return false; /*throw exception_io_data( "Multiple RIFF LIST INFO chunks found" );*/
            }
            else return false; /* unknown LIST chunk */
            it = chunk_end;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }

        if ( found_data && found_info ) break;
    }

    p_out.set_extra_meta_data( meta_data );

    return true;
}